

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O3

void __thiscall hypermind::CompileUnit::DefineVariable(CompileUnit *this,HMInteger index)

{
  uint uVar1;
  Variable local_10;
  
  if (this->mScopeDepth != -1) {
    return;
  }
  local_10.scopeType = Module;
  local_10.index = index;
  EmitStoreVariable(this,&local_10);
  uVar1 = this->mStackSlotNum - 1;
  this->mStackSlotNum = uVar1;
  if (this->mFn->maxStackSlotNum < uVar1) {
    this->mFn->maxStackSlotNum = uVar1;
  }
  WriteOpcode(this,Pop);
  return;
}

Assistant:

void DefineVariable(HMInteger index) {
            if (mScopeDepth == -1) {
                // 作用域为模块作用域
                EmitStoreVariable(Variable(ScopeType::Module, index));
                EmitPop();
            } else {
//                EmitStoreVariable(Variable(ScopeType::Local, index));
            }

            // 不是模块作用域 不用管
        }